

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BeginKeywordsDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BeginKeywordsDirectiveSyntax,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  BeginKeywordsDirectiveSyntax *pBVar11;
  
  pBVar11 = (BeginKeywordsDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BeginKeywordsDirectiveSyntax *)this->endPtr < pBVar11 + 1) {
    pBVar11 = (BeginKeywordsDirectiveSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pBVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pBVar11->super_DirectiveSyntax).super_SyntaxNode.kind = BeginKeywordsDirective;
  (pBVar11->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pBVar11->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pBVar11->super_DirectiveSyntax).directive.kind = TVar3;
  (pBVar11->super_DirectiveSyntax).directive.field_0x2 = uVar4;
  (pBVar11->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar5.raw;
  (pBVar11->super_DirectiveSyntax).directive.rawLen = uVar6;
  (pBVar11->super_DirectiveSyntax).directive.info = pIVar1;
  (pBVar11->versionSpecifier).kind = TVar7;
  (pBVar11->versionSpecifier).field_0x2 = uVar8;
  (pBVar11->versionSpecifier).numFlags = (NumericTokenFlags)NVar9.raw;
  (pBVar11->versionSpecifier).rawLen = uVar10;
  (pBVar11->versionSpecifier).info = pIVar2;
  return pBVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }